

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# catch.hpp
# Opt level: O2

void __thiscall Catch::ConsoleReporter::printOpenHeader(ConsoleReporter *this,string *_name)

{
  ulong in_RAX;
  ostream *poVar1;
  ulong uStack_18;
  Colour colourGuard;
  
  if (getLineOfChars<(char)45>()::line == '\0') {
    uRam0000000000181f60 = 0x2d2d2d2d2d2d2d;
    uRam0000000000181f67._0_1_ = '-';
    uRam0000000000181f67._1_1_ = '-';
    uRam0000000000181f67._2_1_ = '-';
    uRam0000000000181f67._3_1_ = '-';
    uRam0000000000181f67._4_1_ = '-';
    uRam0000000000181f67._5_1_ = '-';
    uRam0000000000181f67._6_1_ = '-';
    uRam0000000000181f67._7_1_ = '-';
    DAT_00181f50 = '-';
    DAT_00181f50_1._0_1_ = '-';
    DAT_00181f50_1._1_1_ = '-';
    DAT_00181f50_1._2_1_ = '-';
    DAT_00181f50_1._3_1_ = '-';
    DAT_00181f50_1._4_1_ = '-';
    DAT_00181f50_1._5_1_ = '-';
    DAT_00181f50_1._6_1_ = '-';
    uRam0000000000181f58 = 0x2d2d2d2d2d2d2d;
    DAT_00181f5f = 0x2d;
    DAT_00181f40 = '-';
    DAT_00181f40_1._0_1_ = '-';
    DAT_00181f40_1._1_1_ = '-';
    DAT_00181f40_1._2_1_ = '-';
    DAT_00181f40_1._3_1_ = '-';
    DAT_00181f40_1._4_1_ = '-';
    DAT_00181f40_1._5_1_ = '-';
    DAT_00181f40_1._6_1_ = '-';
    uRam0000000000181f48._0_1_ = '-';
    uRam0000000000181f48._1_1_ = '-';
    uRam0000000000181f48._2_1_ = '-';
    uRam0000000000181f48._3_1_ = '-';
    uRam0000000000181f48._4_1_ = '-';
    uRam0000000000181f48._5_1_ = '-';
    uRam0000000000181f48._6_1_ = '-';
    uRam0000000000181f48._7_1_ = '-';
    DAT_00181f30 = '-';
    DAT_00181f30_1._0_1_ = '-';
    DAT_00181f30_1._1_1_ = '-';
    DAT_00181f30_1._2_1_ = '-';
    DAT_00181f30_1._3_1_ = '-';
    DAT_00181f30_1._4_1_ = '-';
    DAT_00181f30_1._5_1_ = '-';
    DAT_00181f30_1._6_1_ = '-';
    uRam0000000000181f38._0_1_ = '-';
    uRam0000000000181f38._1_1_ = '-';
    uRam0000000000181f38._2_1_ = '-';
    uRam0000000000181f38._3_1_ = '-';
    uRam0000000000181f38._4_1_ = '-';
    uRam0000000000181f38._5_1_ = '-';
    uRam0000000000181f38._6_1_ = '-';
    uRam0000000000181f38._7_1_ = '-';
    getLineOfChars<(char)45>()::line = '-';
    getLineOfChars<(char)45>()::line_1._0_1_ = '-';
    getLineOfChars<(char)45>()::line_1._1_1_ = '-';
    getLineOfChars<(char)45>()::line_1._2_1_ = '-';
    getLineOfChars<(char)45>()::line_1._3_1_ = '-';
    getLineOfChars<(char)45>()::line_1._4_1_ = '-';
    getLineOfChars<(char)45>()::line_1._5_1_ = '-';
    getLineOfChars<(char)45>()::line_1._6_1_ = '-';
    uRam0000000000181f28._0_1_ = '-';
    uRam0000000000181f28._1_1_ = '-';
    uRam0000000000181f28._2_1_ = '-';
    uRam0000000000181f28._3_1_ = '-';
    uRam0000000000181f28._4_1_ = '-';
    uRam0000000000181f28._5_1_ = '-';
    uRam0000000000181f28._6_1_ = '-';
    uRam0000000000181f28._7_1_ = '-';
    DAT_00181f6f = 0;
  }
  uStack_18 = in_RAX;
  poVar1 = std::operator<<((this->super_StreamingReporterBase<Catch::ConsoleReporter>).stream,
                           &getLineOfChars<(char)45>()::line);
  std::operator<<(poVar1,'\n');
  uStack_18 = uStack_18 & 0xffffffffffffff;
  Colour::use(Headers);
  printHeaderString(this,_name,0);
  Colour::~Colour(&colourGuard);
  return;
}

Assistant:

void ConsoleReporter::printOpenHeader(std::string const& _name) {
    stream << getLineOfChars<'-'>() << '\n';
    {
        Colour colourGuard(Colour::Headers);
        printHeaderString(_name);
    }
}